

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontAtlas::ImFontAtlas(ImFontAtlas *this)

{
  void *in_RDI;
  ImVec4 *local_40;
  
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x30));
  ImVec2::ImVec2((ImVec2 *)((long)in_RDI + 0x38));
  ImVector<ImFont_*>::ImVector((ImVector<ImFont_*> *)((long)in_RDI + 0x40));
  ImVector<ImFontAtlasCustomRect>::ImVector
            ((ImVector<ImFontAtlasCustomRect> *)((long)in_RDI + 0x50));
  ImVector<ImFontConfig>::ImVector((ImVector<ImFontConfig> *)((long)in_RDI + 0x60));
  local_40 = (ImVec4 *)((long)in_RDI + 0x70);
  do {
    ImVec4::ImVec4(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (ImVec4 *)((long)in_RDI + 0x470));
  memset(in_RDI,0,0x488);
  *(undefined4 *)((long)in_RDI + 0x14) = 1;
  *(undefined4 *)((long)in_RDI + 0x480) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0x47c) = 0xffffffff;
  return;
}

Assistant:

ImFontAtlas::ImFontAtlas()
{
    memset(this, 0, sizeof(*this));
    TexGlyphPadding = 1;
    PackIdMouseCursors = PackIdLines = -1;
}